

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::HttpServer::HttpServer
          (HttpServer *this,Timer *timer,HttpHeaderTable *requestHeaderTable,HttpService *service,
          Settings *settings)

{
  undefined8 uVar1;
  ReducePromises<void> node;
  PromiseFulfiller<void> *pPVar2;
  WeakFulfiller<void> *params;
  uint uVar3;
  OneOf<kj::HttpService_*,_kj::Function<kj::Own<kj::HttpService,_std::nullptr_t>_(kj::AsyncIoStream_&)>_>
  local_b0;
  PromiseFulfillerPair<void> local_98;
  PromiseArenaMember *local_80;
  Settings local_78;
  
  local_b0.tag = 1;
  local_78.headerTimeout.value = (settings->headerTimeout).value;
  local_78.pipelineTimeout.value = (settings->pipelineTimeout).value;
  local_78.canceledUploadGracePeriod.value = (settings->canceledUploadGracePeriod).value;
  local_78.canceledUploadGraceBytes = settings->canceledUploadGraceBytes;
  local_78.errorHandler.ptr = (settings->errorHandler).ptr;
  local_78.callbacks.ptr = (settings->callbacks).ptr;
  local_78.webSocketErrorHandler.ptr = (settings->webSocketErrorHandler).ptr;
  local_78.webSocketCompressionMode = settings->webSocketCompressionMode;
  local_b0.field_1._0_8_ = service;
  params = (WeakFulfiller<void> *)operator_new(0x18);
  (params->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (params->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00629ab8;
  (params->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00629af0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_80,params);
  local_98.promise.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_80;
  local_98.fulfiller.disposer = &(params->super_WeakFulfillerBase).super_Disposer;
  local_98.fulfiller.ptr = (PromiseFulfiller<void> *)params;
  HttpServer(this,timer,requestHeaderTable,&local_b0,&local_78,&local_98);
  pPVar2 = local_98.fulfiller.ptr;
  if ((WeakFulfiller<void> *)local_98.fulfiller.ptr != (WeakFulfiller<void> *)0x0) {
    local_98.fulfiller.ptr = (PromiseFulfiller<void> *)0x0;
    (**((Disposer *)&(local_98.fulfiller.disposer)->_vptr_Disposer)->_vptr_Disposer)
              (local_98.fulfiller.disposer,
               (((PromiseFulfiller<void> *)&pPVar2->super_PromiseRejector)->super_PromiseRejector).
               _vptr_PromiseRejector[-2] +
               (long)&(((PromiseFulfiller<void> *)&pPVar2->super_PromiseRejector)->
                      super_PromiseRejector)._vptr_PromiseRejector);
  }
  node.super_PromiseBase.node.ptr = (PromiseBase)(PromiseBase)local_98.promise;
  if (local_98.promise.super_PromiseBase.node.ptr != (OwnPromiseNode)0x0) {
    local_98.promise.super_PromiseBase.node.ptr = (PromiseBase)(OwnPromiseNode)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.super_PromiseBase.node.ptr);
  }
  uVar1 = local_b0.field_1._8_8_;
  uVar3 = 0;
  if (local_b0.tag != 1) {
    uVar3 = local_b0.tag;
  }
  if (uVar3 == 2) {
    local_b0.tag = 0;
    if ((long *)local_b0.field_1._8_8_ != (long *)0x0) {
      local_b0.field_1._8_8_ = 0;
      (***(_func_int ***)local_b0.field_1._0_8_)
                (local_b0.field_1._0_8_,uVar1 + *(long *)(*(long *)uVar1 + -0x10));
    }
  }
  return;
}

Assistant:

HttpServer::HttpServer(kj::Timer& timer, const HttpHeaderTable& requestHeaderTable,
                       HttpService& service, Settings settings)
    : HttpServer(timer, requestHeaderTable, &service, settings,
                 kj::newPromiseAndFulfiller<void>()) {}